

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

wchar_t borg_defend_aux_mass_genocide(wchar_t p1)

{
  ushort uVar1;
  loc grid1;
  monster_race *pmVar2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_kill *pbVar5;
  wchar_t local_54;
  monster_race *tmp_r_ptr;
  borg_kill *tmp_kill;
  monster_race *r_ptr;
  borg_kill *kill;
  int local_20;
  wchar_t p;
  wchar_t b_p;
  wchar_t p2;
  wchar_t i;
  wchar_t hit;
  wchar_t p1_local;
  
  p2 = L'\0';
  local_20 = 0;
  if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
     ((((_Var3 = borg_spell_okay_fail(MASS_BANISHMENT,0x28), _Var3 ||
        (_Var3 = borg_equips_item(act_banishment,true), _Var3)) || (borg.trait[0xf9] != 0)) &&
      (((avoidance * 0xc) / 10 <= p1 || ((borg_simulate & 1U) == 0)))))) {
    for (b_p = L'\x01'; pmVar2 = r_info, b_p < borg_kills_nxt; b_p = b_p + L'\x01') {
      pbVar5 = borg_kills + b_p;
      uVar1 = pbVar5->r_idx;
      if ((((pbVar5->r_idx != 0) && ((int)(uint)pbVar5->r_idx < (int)(z_info->r_max - 1))) &&
          (grid1.y = borg.c.y, grid1.x = borg.c.x, wVar4 = distance(grid1,pbVar5->pos),
          wVar4 < L'\x15')) &&
         (_Var3 = flag_has_dbg(pmVar2[uVar1].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var3)) {
        wVar4 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',b_p,true,true);
        local_20 = local_20 + wVar4;
        p2 = p2 + L'\x03';
      }
    }
    p = p1 - local_20;
    if (p < L'\0') {
      p = L'\0';
    }
    if ((p2 * 0xc) / 10 < borg.trait[0x1b]) {
      p = p + p2;
      if ((L'\t' < borg_fighting_unique) && (8 < p2 / 3)) {
        p = (p * 6) / 10;
      }
      if (p < p1) {
        if (borg_fighting_unique == L'\0') {
          local_54 = (int)avoidance / 2;
        }
        else {
          local_54 = ((int)avoidance << 1) / 3;
        }
        if (p <= local_54) {
          if ((borg_simulate & 1U) != 0) {
            return p1 - p;
          }
          _Var3 = borg_read_scroll(sv_scroll_mass_banishment);
          if (((_Var3) || (_Var3 = borg_activate_item(act_banishment), _Var3)) ||
             (_Var3 = borg_spell(MASS_BANISHMENT), _Var3)) {
            for (b_p = L'\x01'; b_p < borg_kills_nxt; b_p = b_p + L'\x01') {
              pbVar5 = borg_kills + b_p;
              if (((pbVar5->r_idx != 0) && ((int)(uint)pbVar5->r_idx < (int)(z_info->r_max - 1))) &&
                 (_Var3 = flag_has_dbg(r_info[pbVar5->r_idx].flags,0xb,1,"tmp_r_ptr->flags",
                                       "RF_UNIQUE"), !_Var3)) {
                borg_delete_kill(b_p);
              }
            }
            return p1 - p;
          }
        }
      }
    }
  }
  return L'\0';
}

Assistant:

static int borg_defend_aux_mass_genocide(int p1)
{
    int hit = 0, i = 0, p2;
    int b_p = 0, p;

    borg_kill           *kill;
    struct monster_race *r_ptr;

    /* Cant when screwed */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISFORGET])
        return 0;

    /* see if prayer is legal */
    if (!borg_spell_okay_fail(MASS_BANISHMENT, 40)
        && !borg_equips_item(act_banishment, true)
        && (borg.trait[BI_AMASSBAN] == 0)) /* Mass Banishment scroll */
        return 0;

    /* See if he is in real danger */
    if (p1 < avoidance * 12 / 10 && borg_simulate)
        return 0;

    /* Find a monster and calculate its danger */
    for (i = 1; i < borg_kills_nxt; i++) {

        /* Monster */
        kill  = &borg_kills[i];
        r_ptr = &r_info[kill->r_idx];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* "player ghosts" */
        if (kill->r_idx >= z_info->r_max - 1)
            continue;

        /* Check the distance */
        if (distance(borg.c, kill->pos) > 20)
            continue;

        /* we try not to genocide uniques */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            continue;

        /* Calculate danger */
        p = borg_danger_one_kill(borg.c.y, borg.c.x, 1, i, true, true);

        /* store the danger for this type of monster */
        b_p = b_p + p;
        hit = hit + 3;
    }

    /* normalize the value */
    p2 = (p1 - b_p);
    if (p2 < 0)
        p2 = 0;

    /* if strain (plus a pad incase we did not know about some monsters)
     * is greater than hp, don't cast it
     */
    if ((hit * 12 / 10) >= borg.trait[BI_CURHP])
        return 0;

    /* Penalize the strain from casting the spell */
    p2 = p2 + hit;

    /* Be more likely to use this if fighting Morgoth */
    if (borg_fighting_unique >= 10 && (hit / 3 > 8)) {
        p2 = p2 * 6 / 10;
    }

    /* if this is an improvement and we may not avoid monster now and */
    /* we may have before */
    if (p1 > p2
        && p2 <= (borg_fighting_unique ? (avoidance * 2 / 3)
                                       : (avoidance / 2))) {
        /* Simulation */
        if (borg_simulate)
            return (p1 - p2);

        /* Cast the spell */
        if (borg_read_scroll(sv_scroll_mass_banishment)
            || borg_activate_item(act_banishment)
            || borg_spell(MASS_BANISHMENT)) {

            /* Remove monsters from the borg_kill */
            for (i = 1; i < borg_kills_nxt; i++) {
                borg_kill           *tmp_kill;
                struct monster_race *tmp_r_ptr;

                /* Monster */
                tmp_kill  = &borg_kills[i];

                /* dead monsters */
                if (tmp_kill->r_idx == 0)
                    continue;

                /* "player ghosts" */
                if (tmp_kill->r_idx >= z_info->r_max - 1)
                    continue;

                tmp_r_ptr = &r_info[tmp_kill->r_idx];

                /* Cant kill uniques like this */
                if (rf_has(tmp_r_ptr->flags, RF_UNIQUE))
                    continue;

                /* remove this monster */
                borg_delete_kill(i);
            }

            /* Value */
            return (p1 - p2);
        }
    }
    /* Not worth it */
    return 0;
}